

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

void __thiscall
pybind11::detail::values_and_holders::iterator::iterator
          (iterator *this,instance *inst,type_vec *tinfo)

{
  const_iterator cVar1;
  size_type sVar2;
  reference pptVar3;
  type_info *local_40;
  type_vec *tinfo_local;
  instance *inst_local;
  iterator *this_local;
  
  this->inst = inst;
  cVar1 = std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
          ::begin(tinfo);
  (this->typeit)._M_current = cVar1._M_current;
  sVar2 = std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
          ::size(tinfo);
  if (sVar2 == 0) {
    local_40 = (type_info *)0x0;
  }
  else {
    pptVar3 = __gnu_cxx::
              __normal_iterator<pybind11::detail::type_info_*const_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>
              ::operator*(&this->typeit);
    local_40 = *pptVar3;
  }
  value_and_holder::value_and_holder(&this->curr,inst,local_40,0,0);
  return;
}

Assistant:

iterator(instance *inst, const type_vec &tinfo)
            : inst{inst}, typeit{tinfo.begin()},
            curr(inst /* instance */,
                 tinfo.size() > 0 ? *typeit : nullptr /* type info */,
                 0, /* vpos: (non-simple types only): the first vptr comes first */
                 0 /* index */)
        {}